

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

int lyp_check_import(lys_module *module,char *value,lys_import *imp)

{
  uint8_t uVar1;
  ly_ctx *ctx;
  int iVar2;
  lys_module *plVar3;
  long lVar4;
  char *pcVar5;
  char *format;
  char *pcVar6;
  lys_module *plVar7;
  
  ctx = module->ctx;
  for (lVar4 = 0; (ulong)module->imp_size * 0x38 - lVar4 != 0; lVar4 = lVar4 + 0x38) {
    plVar7 = *(lys_module **)(module->imp->rev + lVar4 + -0x10);
    if ((plVar7 != (lys_module *)0x0) && (plVar7->name == value)) {
      if (imp->rev[0] == '\0') goto LAB_0012681d;
      if ((plVar7->rev_size != '\0') && (iVar2 = strcmp(plVar7->rev->date,imp->rev), iVar2 == 0)) {
        imp->module = plVar7;
        return 0;
      }
      goto LAB_001268ff;
    }
  }
  plVar7 = (lys_module *)0x0;
LAB_0012681d:
  iVar2 = lyp_check_circmod(module,value,1);
  if (iVar2 != 0) {
    return -1;
  }
  pcVar6 = imp->rev;
  pcVar5 = pcVar6;
  if (imp->rev[0] == '\0') {
    pcVar5 = (char *)0x0;
  }
  plVar3 = ly_ctx_load_sub_module
                     (module->ctx,(lys_module *)0x0,value,pcVar5,(module->ctx->models).flags & 1,
                      (unres_schema *)0x0);
  imp->module = plVar3;
  if (plVar3 == (lys_module *)0x0) {
    pcVar6 = module->name;
    format = "Importing \"%s\" module into \"%s\" failed.";
    pcVar5 = value;
LAB_0012694b:
    ly_log(ctx,LY_LLERR,LY_EVALID,format,pcVar5,pcVar6);
    return -1;
  }
  if (((*pcVar6 != '\0') && (plVar3->rev_size != '\0')) &&
     (iVar2 = strcmp(pcVar6,plVar3->rev->date), iVar2 != 0)) {
    format = "\"%s\" import of module \"%s\" in revision \"%s\" not found.";
    pcVar5 = module->name;
    pcVar6 = value;
    goto LAB_0012694b;
  }
  if (plVar7 == (lys_module *)0x0) {
    return 0;
  }
  if (plVar7 == plVar3) {
    uVar1 = plVar7->rev_size;
    if (uVar1 == plVar3->rev_size) {
      if (uVar1 == '\0') goto LAB_001269a6;
    }
    else if ((uVar1 == '\0') || (plVar3->rev_size != '\0')) goto LAB_001268ff;
    iVar2 = strcmp(plVar7->rev->date,plVar3->rev->date);
    if (iVar2 == 0) {
LAB_001269a6:
      ly_log(ctx,LY_LLWRN,LY_SUCCESS,
             "Module \"%s\" is imported by \"%s\" multiple times with different prefixes.",
             plVar7->name,module->name);
      return 0;
    }
  }
LAB_001268ff:
  ly_vlog(ctx,LYE_INARG,LY_VLOG_NONE,(void *)0x0,value,"import");
  ly_vlog(ctx,LYE_SPEC,LY_VLOG_NONE,(void *)0x0,"Importing multiple revisions of module \"%s\".",
          value);
  return -1;
}

Assistant:

int
lyp_check_import(struct lys_module *module, const char *value, struct lys_import *imp)
{
    int i;
    struct lys_module *dup = NULL;
    struct ly_ctx *ctx = module->ctx;

    /* check for importing a single module in multiple revisions */
    for (i = 0; i < module->imp_size; i++) {
        if (!module->imp[i].module) {
            /* skip the not yet filled records */
            continue;
        }
        if (ly_strequal(module->imp[i].module->name, value, 1)) {
            /* check revisions, including multiple revisions of a single module is error */
            if (imp->rev[0] && (!module->imp[i].module->rev_size || strcmp(module->imp[i].module->rev[0].date, imp->rev))) {
                /* the already imported module has
                 * - no revision, but here we require some
                 * - different revision than the one required here */
                LOGVAL(ctx, LYE_INARG, LY_VLOG_NONE, NULL, value, "import");
                LOGVAL(ctx, LYE_SPEC, LY_VLOG_NONE, NULL, "Importing multiple revisions of module \"%s\".", value);
                return -1;
            } else if (!imp->rev[0]) {
                /* no revision, remember the duplication, but check revisions after loading the module
                 * because the current revision can be the same (then it is ok) or it can differ (then it
                 * is error */
                dup = module->imp[i].module;
                break;
            }

            /* there is duplication, but since prefixes differs (checked in caller of this function),
             * it is ok */
            imp->module = module->imp[i].module;
            return 0;
        }
    }

    /* circular import check */
    if (lyp_check_circmod(module, value, 1)) {
        return -1;
    }

    /* load module - in specific situations it tries to get the module from the context */
    imp->module = (struct lys_module *)ly_ctx_load_sub_module(module->ctx, NULL, value, imp->rev[0] ? imp->rev : NULL,
                                                              module->ctx->models.flags & LY_CTX_ALLIMPLEMENTED ? 1 : 0,
                                                              NULL);

    /* check the result */
    if (!imp->module) {
        LOGERR(ctx, LY_EVALID, "Importing \"%s\" module into \"%s\" failed.", value, module->name);
        return -1;
    }

    if (imp->rev[0] && imp->module->rev_size && strcmp(imp->rev, imp->module->rev[0].date)) {
        LOGERR(ctx, LY_EVALID, "\"%s\" import of module \"%s\" in revision \"%s\" not found.",
               module->name, value, imp->rev);
        return -1;
    }

    if (dup) {
        /* check the revisions */
        if ((dup != imp->module) ||
                (dup->rev_size != imp->module->rev_size && (!dup->rev_size || imp->module->rev_size)) ||
                (dup->rev_size && strcmp(dup->rev[0].date, imp->module->rev[0].date))) {
            /* - modules are not the same
             * - one of modules has no revision (except they both has no revision)
             * - revisions of the modules are not the same */
            LOGVAL(ctx, LYE_INARG, LY_VLOG_NONE, NULL, value, "import");
            LOGVAL(ctx, LYE_SPEC, LY_VLOG_NONE, NULL, "Importing multiple revisions of module \"%s\".", value);
            return -1;
        } else {
            LOGWRN(ctx, "Module \"%s\" is imported by \"%s\" multiple times with different prefixes.", dup->name, module->name);
        }
    }

    return 0;
}